

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_matrix.cpp
# Opt level: O2

void MatrixMultiply(Matrix m1,Matrix m2,Matrix prod)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  double dVar6;
  
  if ((*(char *)((long)m1 + -6) == *(char *)((long)m2 + -7)) &&
     (bVar2 = *(byte *)((long)prod + -7), bVar2 == *(byte *)((long)m1 + -7))) {
    bVar4 = *(byte *)((long)prod + -6);
    if (bVar4 == *(byte *)((long)m2 + -6)) {
      for (uVar1 = 0; uVar1 < bVar2; uVar1 = uVar1 + 1) {
        for (uVar3 = 0; uVar3 < bVar4; uVar3 = uVar3 + 1) {
          dVar6 = 0.0;
          for (uVar5 = 0; *(byte *)((long)m1 + -6) != uVar5; uVar5 = uVar5 + 1) {
            dVar6 = dVar6 + m1[uVar1][uVar5] * m2[uVar5][uVar3];
          }
          prod[uVar1][uVar3] = dVar6;
          bVar4 = *(byte *)((long)m2 + -6);
        }
        bVar2 = *(byte *)((long)m1 + -7);
      }
      return;
    }
  }
  Am_Error("MatrixMultiply");
}

Assistant:

void
MatrixMultiply(Matrix m1, Matrix m2, Matrix prod)
{
  int i, j, k;
  double sum;

  if (NCOLS(m1) != NROWS(m2))
    Am_Error("MatrixMultiply"); //: Can't multiply %dx%d and %dx%d matrices",
  //NROWS(m1), NCOLS(m1), NROWS(m2), NCOLS(m2));
  if (NROWS(prod) != NROWS(m1) || NCOLS(prod) != NCOLS(m2))
    Am_Error(
        "MatrixMultiply"); //: %dx%d times %dx%d does not give %dx%d product",
  //NROWS(m1), NCOLS(m1), NROWS(m2), NCOLS(m2),
  //NROWS(prod), NCOLS(prod));

  for (i = 0; i < NROWS(m1); i++)
    for (j = 0; j < NCOLS(m2); j++) {
      sum = 0;
      for (k = 0; k < NCOLS(m1); k++)
        sum += m1[i][k] * m2[k][j];
      prod[i][j] = sum;
    }
}